

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax-test.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  pointer *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  pointer pTVar3;
  element_type *peVar4;
  ostream *poVar5;
  char *pcVar6;
  string *local_2b0;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_228;
  const_iterator local_220;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_218;
  const_iterator local_210;
  exception *e;
  undefined1 local_1f0 [8];
  TokenReader reader;
  Ptr node;
  string local_1b8 [32];
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_198;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_190;
  iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator local_160;
  allocator local_15f;
  allocator local_15e;
  allocator local_15d [20];
  allocator local_149;
  string *local_148;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  testCases;
  vector<Token,_std::allocator<Token>_> res;
  char **param_1_local;
  int param_0_local;
  
  testCases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)
             &testCases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __range1._5_1_ = 1;
  local_148 = local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"int age = 40",&local_149);
  local_148 = local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"int arg, b = 23, a=3,c",local_15d);
  local_148 = local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"int a = 2 + 3 *5 + 8 + 9 *100",&local_15e);
  local_148 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"int a = 2 + ((3 +5)*9 + (9 - 2))",&local_15f);
  local_148 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"int b = 2 + 3 +5",&local_160);
  local_148 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"int ",(allocator *)((long)&__range1 + 7));
  local_148 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"int",(allocator *)((long)&__range1 + 6));
  __range1._5_1_ = 0;
  local_60 = (iterator)local_140;
  local_58 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 4));
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 4));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 4));
  local_2b0 = (string *)&local_60;
  do {
    local_2b0 = local_2b0 + -0x20;
    std::__cxx11::string::~string(local_2b0);
  } while (local_2b0 != local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e);
  std::allocator<char>::~allocator((allocator<char> *)local_15d);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
  item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&item), bVar1) {
    iter._M_current =
         (Token *)__gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    grammar_analyze((string *)iter._M_current,
                    (vector *)
                    &testCases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_190._M_current =
         (Token *)std::vector<Token,_std::allocator<Token>_>::begin
                            ((vector<Token,_std::allocator<Token>_> *)
                             &testCases.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_198._M_current =
           (Token *)std::vector<Token,_std::allocator<Token>_>::end
                              ((vector<Token,_std::allocator<Token>_> *)
                               &testCases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_190,&local_198);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator->
                (&local_190);
      type2str_abi_cxx11_((TokenType *)local_1b8);
      poVar5 = std::operator<<((ostream *)&std::cout,local_1b8);
      poVar5 = std::operator<<(poVar5,": ");
      pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
               operator->(&local_190);
      poVar5 = std::operator<<(poVar5,(string *)&pTVar3->val);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1b8);
      __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
                (&local_190,0);
    }
    std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)&reader.pos);
    TokenReader::TokenReader
              ((TokenReader *)local_1f0,
               (vector<Token,_std::allocator<Token>_> *)
               &testCases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Singleton<SimpleSyntaxAnalyzer>::instance();
    SimpleSyntaxAnalyzer::analyze((TokenReader *)&e);
    std::shared_ptr<SimpleASTNode>::operator=
              ((shared_ptr<SimpleASTNode> *)&reader.pos,(shared_ptr<SimpleASTNode> *)&e);
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)&e);
    bVar1 = std::operator!=((shared_ptr<SimpleASTNode> *)&reader.pos,(nullptr_t)0x0);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&reader.pos);
      SimpleASTNode::print((int)peVar4);
    }
    this = &testCases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_218._M_current =
         (Token *)std::vector<Token,_std::allocator<Token>_>::begin
                            ((vector<Token,_std::allocator<Token>_> *)this);
    __gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>::
    __normal_iterator<Token*>
              ((__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>> *)
               &local_210,&local_218);
    local_228._M_current =
         (Token *)std::vector<Token,_std::allocator<Token>_>::end
                            ((vector<Token,_std::allocator<Token>_> *)this);
    __gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>::
    __normal_iterator<Token*>
              ((__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>> *)
               &local_220,&local_228);
    std::vector<Token,_std::allocator<Token>_>::erase
              ((vector<Token,_std::allocator<Token>_> *)this,local_210,local_220);
    bVar2 = TokenReader::empty();
    pcVar6 = "TokenReader still has items\n";
    if ((bVar2 & 1) != 0) {
      pcVar6 = "TokenReader is empty\n";
    }
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    TokenReader::~TokenReader((TokenReader *)local_1f0);
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)&reader.pos);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)
             &testCases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(int, char**) {
    std::vector<Token> res = {};

    std::vector<std::string> testCases = {"int age = 40", "int arg, b = 23, a=3,c", "int a = 2 + 3 *5 + 8 + 9 *100", \
    "int a = 2 + ((3 +5)*9 + (9 - 2))", "int b = 2 + 3 +5", "int ", "int"};

    for (auto& item : testCases) {
        grammar_analyze(item, res);
        for (std::vector<Token>::iterator iter = res.begin(); iter != res.end(); iter++)
            std::cout << type2str(iter->type) << ": " << iter->val << std::endl;
        SimpleASTNode::Ptr node;
        TokenReader reader(res);
        try {
            node = SimpleSyntaxAnalyzer::instance()->analyze(reader);
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
            exit(1);
        }

        if (node != nullptr)
            node->print(0);
        res.erase(res.begin(), res.end());
        std::cout << (reader.empty() ? "TokenReader is empty\n" : "TokenReader still has items\n") << std::endl;
    }
    return 0;
}